

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

void __thiscall
dtc::fdt::property::property
          (property *this,text_input_buffer *input,string *k,string_set *l,bool semicolonTerminated,
          define_map *defines)

{
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  byte bVar1;
  pointer pcVar2;
  element_type *peVar3;
  size_t sVar4;
  undefined4 uVar5;
  bool bVar6;
  _Elt_pointer psVar7;
  _Elt_pointer psVar8;
  int iVar9;
  _Elt_pointer psVar10;
  char *msg;
  _Elt_pointer psVar11;
  __alloc_node_gen_t __alloc_node_gen;
  string filename;
  source_location loc;
  undefined1 local_e8 [16];
  value_type local_d8;
  define_map *local_78;
  string local_70;
  source_location local_50;
  
  (this->key)._M_dataplus._M_p = (pointer)&(this->key).field_2;
  pcVar2 = (k->_M_dataplus)._M_p;
  local_78 = defines;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar2,pcVar2 + k->_M_string_length);
  local_d8.label._M_dataplus._M_p = (pointer)&this->labels;
  (this->labels)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->labels)._M_h._M_bucket_count = (l->_M_h)._M_bucket_count;
  (this->labels)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->labels)._M_h._M_element_count = (l->_M_h)._M_element_count;
  uVar5 = *(undefined4 *)&(l->_M_h)._M_rehash_policy.field_0x4;
  sVar4 = (l->_M_h)._M_rehash_policy._M_next_resize;
  (this->labels)._M_h._M_rehash_policy._M_max_load_factor =
       (l->_M_h)._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->labels)._M_h._M_rehash_policy.field_0x4 = uVar5;
  (this->labels)._M_h._M_rehash_policy._M_next_resize = sVar4;
  (this->labels)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)local_d8.label._M_dataplus._M_p,&l->_M_h,
             (_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>_>_>
              *)&local_d8);
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->values).
  super__Vector_base<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->valid = true;
  this_00 = &input->input_stack;
  while( true ) {
    text_input_buffer::next_token(input);
    psVar7 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar7 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_start._M_cur) break;
    if (psVar7 == (input->input_stack).c.
                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar7 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = peVar3->cursor;
    if (((long)iVar9 < 0) || (peVar3->size <= iVar9)) break;
    bVar1 = peVar3->buffer[iVar9];
    if (bVar1 < 0x2f) {
      if (bVar1 == 0x22) {
        parse_string(this,input);
      }
      else if (bVar1 == 0x24) {
        parse_define(this,input,local_78);
        if (this->valid == false) break;
      }
      else {
        if (bVar1 != 0x26) break;
        parse_reference(this,input);
      }
    }
    else if (bVar1 < 0x3c) {
      if (bVar1 == 0x2f) {
        bVar6 = text_input_buffer::consume(input,"/incbin/(\"");
        if (!bVar6) {
          local_d8.label._M_dataplus._M_p = (pointer)0x0;
          bVar6 = text_input_buffer::consume(input,"/bits/");
          this->valid = bVar6;
          text_input_buffer::next_token(input);
          bVar6 = text_input_buffer::consume_integer(input,(unsigned_long_long *)&local_d8);
          bVar6 = (bool)(bVar6 & this->valid);
          this->valid = bVar6;
          if ((((long)local_d8.label._M_dataplus._M_p << 0x3d |
               (ulong)(local_d8.label._M_dataplus._M_p + -8) >> 3) < 8) &&
             ((0x8bUL >> ((ulong)(local_d8.label._M_dataplus._M_p + -8) >> 3 & 0x3f) & 1) != 0)) {
            if (bVar6 == false) {
              return;
            }
            text_input_buffer::next_token(input);
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar7 != (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
              if (psVar7 == (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar7 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar9 = peVar3->cursor;
              if (((-1 < (long)iVar9) && (iVar9 < peVar3->size)) && (peVar3->buffer[iVar9] == '<'))
              {
                parse_cells(this,input,(int)local_d8.label._M_dataplus._M_p);
                goto LAB_00122ba6;
              }
            }
            text_input_buffer::parse_error(input,"/bits/ directive is only valid on arrays");
          }
          else {
            text_input_buffer::parse_error(input,"Invalid size for elements");
          }
          goto LAB_00122d5a;
        }
        text_input_buffer::source_location::source_location(&local_50,input);
        text_input_buffer::parse_to_abi_cxx11_(&local_70,input,'\"');
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar7 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00122b40:
          this->valid = false;
          bVar6 = true;
          text_input_buffer::source_location::report_error
                    (&local_50,"Syntax error, expected \'\"\' to terminate /incbin/(");
        }
        else {
          psVar8 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_first;
          psVar10 = psVar7;
          if (psVar7 == psVar8) {
            psVar10 = (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar10[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = peVar3->cursor;
          if ((((long)iVar9 < 0) || (peVar3->size <= iVar9)) || (peVar3->buffer[iVar9] != '\"'))
          goto LAB_00122b40;
          input->cursor = input->cursor + 1;
          if (psVar7 == psVar8) {
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = peVar3->cursor + 1;
          peVar3->cursor = iVar9;
          if (peVar3->size <= iVar9) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&this_00->c);
          }
          this->valid = true;
          local_e8[0] = 0;
          local_d8.label._M_dataplus._M_p = (pointer)&local_d8.label.field_2;
          std::__cxx11::string::_M_construct<char*>((string *)&local_d8,local_e8);
          local_d8.string_data._M_dataplus._M_p = (pointer)&local_d8.string_data.field_2;
          local_d8.type = UNKNOWN;
          local_d8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          local_d8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          local_d8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          local_d8.string_data.field_2._M_local_buf[0] = '\0';
          local_d8.string_data._M_string_length = 0;
          bVar6 = text_input_buffer::read_binary_file(input,&local_70,&local_d8.byte_data);
          this->valid = bVar6;
          msg = "Cannot open binary include file";
          if (bVar6) {
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_start._M_cur) {
LAB_00122c40:
              this->valid = false;
              msg = "Syntax error, expected \')\' to terminate /incbin/(";
              goto LAB_00122c4b;
            }
            psVar8 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_first;
            psVar10 = psVar7;
            if (psVar7 == psVar8) {
              psVar10 = (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar10[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor;
            if ((((long)iVar9 < 0) || (peVar3->size <= iVar9)) || (peVar3->buffer[iVar9] != ')'))
            goto LAB_00122c40;
            input->cursor = input->cursor + 1;
            if (psVar7 == psVar8) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar9 = peVar3->cursor + 1;
            peVar3->cursor = iVar9;
            if (peVar3->size <= iVar9) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
              msg = "Syntax error, expected \')\' to terminate /incbin/(";
              if (this->valid == false) goto LAB_00122c4b;
            }
            std::vector<dtc::fdt::property_value,_std::allocator<dtc::fdt::property_value>_>::
            push_back(&this->values,&local_d8);
            bVar6 = false;
          }
          else {
LAB_00122c4b:
            bVar6 = true;
            text_input_buffer::parse_error(input,msg);
          }
          if (local_d8.byte_data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_d8.byte_data.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_d8.byte_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_d8.byte_data.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.string_data._M_dataplus._M_p != &local_d8.string_data.field_2) {
            operator_delete(local_d8.string_data._M_dataplus._M_p,
                            CONCAT71(local_d8.string_data.field_2._M_allocated_capacity._1_7_,
                                     local_d8.string_data.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8.label._M_dataplus._M_p != &local_d8.label.field_2) {
            operator_delete(local_d8.label._M_dataplus._M_p,
                            local_d8.label.field_2._M_allocated_capacity + 1);
          }
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
        if (local_50.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            ._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_50.b.super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (bVar6) {
          return;
        }
      }
      else if (bVar1 != 0x3b) break;
    }
    else if (bVar1 == 0x3c) {
      parse_cells(this,input,0x20);
    }
    else {
      if (bVar1 != 0x5b) break;
      parse_bytes(this,input);
    }
LAB_00122ba6:
    text_input_buffer::next_token(input);
    psVar7 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_start._M_cur;
    psVar8 = (input->input_stack).c.
             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
             ._M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (psVar8 == psVar7) {
      if (!semicolonTerminated) {
        return;
      }
LAB_00122d4b:
      text_input_buffer::parse_error(input,"Expected ; at end of property");
      goto LAB_00122d5a;
    }
    psVar10 = (input->input_stack).c.
              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_first;
    psVar11 = psVar8;
    if (psVar8 == psVar10) {
      psVar11 = (input->input_stack).c.
                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar11[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = peVar3->cursor;
    if ((((long)iVar9 < 0) || (peVar3->size <= iVar9)) || (peVar3->buffer[iVar9] != ',')) {
      if (!semicolonTerminated) {
        return;
      }
      if (psVar8 != psVar7) {
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_first;
        psVar10 = psVar8;
        if (psVar8 == psVar7) {
          psVar10 = (input->input_stack).c.
                    super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar3 = psVar10[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr;
        iVar9 = peVar3->cursor;
        if (((-1 < (long)iVar9) && (iVar9 < peVar3->size)) && (peVar3->buffer[iVar9] == ';')) {
          input->cursor = input->cursor + 1;
          if (psVar8 == psVar7) {
            psVar8 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar9 = peVar3->cursor + 1;
          peVar3->cursor = iVar9;
          if (iVar9 < peVar3->size) {
            return;
          }
          std::
          deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
          ::pop_back(&this_00->c);
          return;
        }
      }
      goto LAB_00122d4b;
    }
    input->cursor = input->cursor + 1;
    if (psVar8 == psVar10) {
      psVar8 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
    }
    peVar3 = psVar8[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar9 = peVar3->cursor + 1;
    peVar3->cursor = iVar9;
    if (peVar3->size <= iVar9) {
      std::
      deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
      ::pop_back(&this_00->c);
    }
  }
  text_input_buffer::parse_error(input,"Invalid property value.");
LAB_00122d5a:
  this->valid = false;
  return;
}

Assistant:

property::property(text_input_buffer &input,
                   string &&k,
                   string_set &&l,
                   bool semicolonTerminated,
                   define_map *defines) : key(k), labels(l), valid(true)
{
	do {
		input.next_token();
		switch (*input)
		{
			case '$':
			{
				parse_define(input, defines);
				if (valid)
				{
					break;
				}
			}
			[[fallthrough]];
			default:
				input.parse_error("Invalid property value.");
				valid = false;
				return;
			case '/':
			{
				if (input.consume("/incbin/(\""))
				{
					auto loc = input.location();
					std::string filename = input.parse_to('"');
					if (!(valid = input.consume('"')))
					{
						loc.report_error("Syntax error, expected '\"' to terminate /incbin/(");
						return;
					}
					property_value v;
					if (!(valid = input.read_binary_file(filename, v.byte_data)))
					{
						input.parse_error("Cannot open binary include file");
						return;
					}
					if (!(valid &= input.consume(')')))
					{
						input.parse_error("Syntax error, expected ')' to terminate /incbin/(");
						return;
					}
					values.push_back(v);
					break;
				}
				unsigned long long bits = 0;
				valid = input.consume("/bits/");
				input.next_token();
				valid &= input.consume_integer(bits);
				if ((bits != 8) &&
				    (bits != 16) &&
				    (bits != 32) &&
				    (bits != 64)) {
					input.parse_error("Invalid size for elements");
					valid = false;
				}
				if (!valid) return;
				input.next_token();
				if (*input != '<')
				{
					input.parse_error("/bits/ directive is only valid on arrays");
					valid = false;
					return;
				}
				parse_cells(input, bits);
				break;
			}
			case '"':
				parse_string(input);
				break;
			case '<':
				parse_cells(input, 32);
				break;
			case '[':
				parse_bytes(input);
				break;
			case '&':
				parse_reference(input);
				break;
			case ';':
			{
				break;
			}
		}
		input.next_token();
	} while (input.consume(','));
	if (semicolonTerminated && !input.consume(';'))
	{
		input.parse_error("Expected ; at end of property");
		valid = false;
	}
}